

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

void check_special_room(boolean newlev)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  level *lev;
  boolean bVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  mkroom *pmVar11;
  monst *pmVar12;
  int roomno;
  char cVar13;
  int roomno_00;
  uint uVar14;
  char *pcVar15;
  long lVar16;
  char *local_68;
  
  strcpy(u.urooms0,u.urooms);
  pcVar15 = u.ushops;
  strcpy(u.ushops0,u.ushops);
  if (newlev == '\0') {
    pcVar8 = in_rooms(level,u.ux,u.uy,0);
    strcpy(u.urooms,pcVar8);
    if (u.urooms[0] == '\0') {
      local_68 = u.ushops_entered;
      pcVar8 = u.uentered;
    }
    else {
      pcVar8 = u.uentered;
      pcVar15 = u.ushops;
      local_68 = u.ushops_entered;
      pcVar10 = u.urooms;
      cVar13 = u.urooms[0];
      do {
        pcVar10 = pcVar10 + 1;
        pcVar9 = strchr(u.urooms0,(int)cVar13);
        if (pcVar9 == (char *)0x0) {
          *pcVar8 = cVar13;
          pcVar8 = pcVar8 + 1;
          cVar13 = pcVar10[-1];
        }
        if ('\x11' < *(char *)((long)level->monsters + (long)cVar13 * 0xd8 + 0x335c)) {
          *pcVar15 = cVar13;
          pcVar15 = pcVar15 + 1;
          cVar13 = pcVar10[-1];
          pcVar9 = strchr(u.ushops0,(int)cVar13);
          if (pcVar9 == (char *)0x0) {
            *local_68 = cVar13;
            local_68 = local_68 + 1;
          }
        }
        cVar13 = *pcVar10;
      } while (cVar13 != '\0');
    }
    *pcVar8 = '\0';
    *pcVar15 = '\0';
    *local_68 = '\0';
    if (u.ushops0[0] == '\0') {
      pcVar15 = u.ushops_left;
    }
    else {
      pcVar15 = u.ushops_left;
      pcVar8 = u.ushops0;
      cVar13 = u.ushops0[0];
      do {
        pcVar8 = pcVar8 + 1;
        pcVar10 = strchr(u.ushops,(int)cVar13);
        if (pcVar10 == (char *)0x0) {
          *pcVar15 = cVar13;
          pcVar15 = pcVar15 + 1;
        }
        cVar13 = *pcVar8;
      } while (cVar13 != '\0');
    }
    *pcVar15 = '\0';
  }
  else {
    u.urooms[0] = '\0';
    u.uentered[0] = '\0';
    u.ushops[0] = '\0';
    u.ushops_entered[0] = '\0';
    strcpy(u.ushops_left,u.ushops0);
  }
  if (u.ushops0[0] != '\0') {
    u_left_shop(u.ushops_left,newlev);
  }
  if (u.uentered[0] != '\0' || u.ushops_entered[0] != '\0') {
    if (u.ushops_entered[0] != '\0') {
      u_entered_shop(u.ushops_entered);
    }
    if (u.uentered[0] != '\0') {
      lVar16 = 0x31a716;
      cVar13 = u.uentered[0];
      do {
        roomno = (int)cVar13;
        roomno_00 = roomno + -3;
        switch(level->rooms[roomno_00].rtype) {
        case '\x02':
          bVar2 = 0;
          pline("You enter an opulent throne room!");
          iVar7 = 2;
          bVar3 = 1;
          goto LAB_001abb6c;
        case '\x03':
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001abaaf;
            pcVar15 = "looks";
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001abaa3;
LAB_001abcfe:
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001abd2f;
            pcVar8 = "muddy";
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001abd23;
          }
          else {
LAB_001abaa3:
            pcVar15 = "feels";
            if (ublindf != (obj *)0x0) {
LAB_001abaaf:
              pcVar15 = "feels";
              if (ublindf->oartifact == '\x1d') {
                pcVar15 = "looks";
              }
            }
            if (u.uprops[0x1e].intrinsic == 0) goto LAB_001abcfe;
LAB_001abd23:
            pcVar8 = "humid";
            if (ublindf != (obj *)0x0) {
LAB_001abd2f:
              pcVar8 = "humid";
              if (ublindf->oartifact == '\x1d') {
                pcVar8 = "muddy";
              }
            }
          }
          bVar3 = 0;
          pline("It %s rather %s down here.",pcVar15,pcVar8);
          iVar7 = 3;
          bVar2 = 1;
          goto LAB_001abb6c;
        default:
          goto switchD_001ab8d2_caseD_4;
        case '\x05':
          pcVar15 = "You enter a giant beehive!";
          goto LAB_001abc96;
        case '\x06':
          iVar7 = midnight();
          if (iVar7 == 0) {
            pline("You have an uncanny feeling...");
          }
          else {
            pcVar15 = locomotion(youmonst.data,"Run");
            pline("%s away!  %s away!",pcVar15,pcVar15);
          }
          bVar3 = 0;
          iVar7 = 6;
          bVar5 = 1;
          bVar2 = 0;
          goto LAB_001abb6e;
        case '\a':
          bVar6 = monstinroom(mons + 0x121,roomno_00);
          if ((((bVar6 == '\0') && (bVar6 = monstinroom(mons + 0x122,roomno_00), bVar6 == '\0')) &&
              (bVar6 = monstinroom(mons + 0x123,roomno_00), bVar6 == '\0')) &&
             (bVar6 = monstinroom(mons + 0x124,roomno_00), bVar6 == '\0')) {
            pcVar15 = "You enter an abandoned barracks.";
          }
          else {
            pcVar15 = "You enter a military barracks!";
          }
          pline(pcVar15);
          iVar7 = 7;
          break;
        case '\b':
          bVar3 = 0;
          pline("Welcome to David\'s treasure zoo!");
          iVar7 = 8;
          bVar4 = 1;
          bVar2 = 0;
          bVar5 = 0;
          goto LAB_001abb71;
        case '\t':
          bVar6 = monstinroom(mons + 0x11e,roomno_00);
          if (bVar6 != '\0') {
            pcVar15 = Hello((monst *)0x0);
            verbalize("%s, %s, welcome to Delphi!",pcVar15,plname);
          }
          check_tutorial_message(0x16c);
          iVar7 = 9;
          break;
        case '\n':
          intemple(roomno);
          goto switchD_001ab8d2_caseD_4;
        case '\v':
          pline("You enter a leprechaun hall!");
          iVar7 = 0xb;
          break;
        case '\f':
          pline("You enter a disgusting nest!");
          iVar7 = 0xc;
          break;
        case '\r':
          pline("You enter an anthole!");
          iVar7 = 0xd;
          break;
        case '\x0e':
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001aba1c;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001aba17;
LAB_001abc8f:
            pcVar15 = "You enter a beautiful garden.";
          }
          else {
LAB_001aba17:
            if (ublindf != (obj *)0x0) {
LAB_001aba1c:
              if (ublindf->oartifact == '\x1d') goto LAB_001abc8f;
            }
            pcVar15 = "The air here smells nice and fresh!";
          }
LAB_001abc96:
          pline(pcVar15);
          goto switchD_001ab8d2_caseD_4;
        case '\x0f':
          pline("You enter a dilapidated armory.");
          iVar7 = 0xf;
          break;
        case '\x10':
          pline("You enter a put of screaming lemures!");
          iVar7 = 0x10;
        }
        bVar3 = 0;
        bVar2 = 0;
LAB_001abb6c:
        bVar5 = 0;
LAB_001abb6e:
        bVar4 = 0;
LAB_001abb71:
        lev = level;
        level->rooms[roomno_00].rtype = '\0';
        pmVar11 = search_special(lev,(schar)iVar7);
        if (((pmVar11 == (mkroom *)0x0) && (uVar14 = iVar7 - 2, uVar14 < 0xf)) &&
           ((0x517bU >> (uVar14 & 0x1f) & 1) != 0)) {
          puVar1 = &(level->flags).field_0x8;
          *(uint *)puVar1 = *(uint *)puVar1 & *(uint *)(&DAT_002aec68 + (ulong)uVar14 * 4);
        }
        if ((bool)(bVar5 | bVar4 | bVar3 | bVar2)) {
          for (pmVar12 = level->monlist; pmVar12 != (monst *)0x0; pmVar12 = pmVar12->nmon) {
            if (((0 < pmVar12->mhp) && ((byte)(pmVar12->mx - 1U) < 0x4f)) &&
               ((byte)pmVar12->my < 0x15)) {
              pcVar15 = in_rooms(level,pmVar12->mx,pmVar12->my,0);
              pcVar15 = strchr(pcVar15,roomno);
              if (((pcVar15 != (char *)0x0) &&
                  ((u.uprops[0x13].extrinsic == 0 && u.uprops[0x13].intrinsic == 0 ||
                   (u.uprops[0x13].blocked != 0)))) &&
                 (uVar14 = mt_random(), uVar14 * -0x55555555 < 0x55555556)) {
                pmVar12->field_0x62 = pmVar12->field_0x62 & 0xf7;
              }
            }
          }
        }
switchD_001ab8d2_caseD_4:
        cVar13 = *(char *)(lVar16 + 1);
        lVar16 = lVar16 + 1;
      } while (cVar13 != '\0');
    }
  }
  return;
}

Assistant:

void check_special_room(boolean newlev)
{
	struct monst *mtmp;
	char *ptr;

	move_update(newlev);

	if (*u.ushops0)
	    u_left_shop(u.ushops_left, newlev);

	if (!*u.uentered && !*u.ushops_entered)		/* implied by newlev */
	    return;		/* no entrance messages necessary */

	/* Did we just enter a shop? */
	if (*u.ushops_entered)
	    u_entered_shop(u.ushops_entered);

	for (ptr = &u.uentered[0]; *ptr; ptr++) {
	    int roomno = *ptr - ROOMOFFSET;
	    int rt = level->rooms[roomno].rtype;

	    /* Did we just enter some other special room? */
	    /* vault.c insists that a vault remain a VAULT,
	     * and temples should remain TEMPLEs,
	     * but everything else gives a message only the first time */
	    switch (rt) {
		case ZOO:
		    pline("Welcome to David's treasure zoo!");
		    break;
		case GARDEN:
		    if (Blind) pline("The air here smells nice and fresh!");
		    else pline("You enter a beautiful garden.");
		    rt = 0;
		    break;
		case SWAMP:
		    pline("It %s rather %s down here.",
			  Blind ? "feels" : "looks",
			  Blind ? "humid" : "muddy");
		    break;
		case COURT:
		    pline("You enter an opulent throne room!");
		    break;
		case LEPREHALL:
		    pline("You enter a leprechaun hall!");
		    break;
		case MORGUE:
		    if (midnight()) {
			const char *run = locomotion(youmonst.data, "Run");
			pline("%s away!  %s away!", run, run);
		    } else
			pline("You have an uncanny feeling...");
		    break;
		case BEEHIVE:
		    pline("You enter a giant beehive!");
		    rt = 0;
		    break;
		case LEMUREPIT:
		    pline("You enter a put of screaming lemures!");
		    break;
		case COCKNEST:
		    pline("You enter a disgusting nest!");
		    break;
		case ARMORY:
		    pline("You enter a dilapidated armory.");
		    break;
		case ANTHOLE:
		    pline("You enter an anthole!");
		    break;
		case BARRACKS:
		    if (monstinroom(&mons[PM_SOLDIER], roomno) ||
			monstinroom(&mons[PM_SERGEANT], roomno) ||
			monstinroom(&mons[PM_LIEUTENANT], roomno) ||
			monstinroom(&mons[PM_CAPTAIN], roomno))
			pline("You enter a military barracks!");
		    else
			pline("You enter an abandoned barracks.");
		    break;
		case DELPHI:
		    if (monstinroom(&mons[PM_ORACLE], roomno))
			verbalize("%s, %s, welcome to Delphi!",
					Hello(NULL), plname);
		    check_tutorial_message(QT_T_ORACLE);
		    break;
		case TEMPLE:
		    intemple(roomno + ROOMOFFSET);
		    /* fall through */
		default:
		    rt = 0;
	    }

	    if (rt != 0) {
		level->rooms[roomno].rtype = OROOM;
		if (!search_special(level, rt)) {
			/* No more room of that type */
			switch(rt) {
			    case COURT:
				level->flags.has_court = 0;
				break;
			    case GARDEN:
				level->flags.has_garden = 0;
				break;
			    case SWAMP:
				level->flags.has_swamp = 0;
				break;
			    case MORGUE:
				level->flags.has_morgue = 0;
				break;
			    case ZOO:
				level->flags.has_zoo = 0;
				break;
			    case BARRACKS:
				level->flags.has_barracks = 0;
				break;
			    case TEMPLE:
				level->flags.has_temple = 0;
				break;
			    case BEEHIVE:
				level->flags.has_beehive = 0;
				break;
			    case LEMUREPIT:
				level->flags.has_lemurepit = 0;
				break;
			}
		}
		if (rt == COURT || rt == SWAMP || rt == MORGUE ||
			rt == ZOO || rt == GARDEN) {
		    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
			if (!DEADMONSTER(mtmp) && isok(mtmp->mx, mtmp->my) &&
				/* wake monsters in the room, not the whole level */
				strchr(in_rooms(level, mtmp->mx, mtmp->my, 0),
				       roomno + ROOMOFFSET) &&
				!Stealth && !rn2(3))
			    mtmp->msleeping = 0;
		    }
		}
	    }
	}

	return;
}